

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.hpp
# Opt level: O0

int __thiscall antlr::InputBuffer::LA(InputBuffer *this,uint i)

{
  int iVar1;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  (**(code **)(*in_RDI + 0x20))(in_RDI,in_ESI);
  iVar1 = CircularQueue<int>::elementAt
                    ((CircularQueue<int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_t)in_RDI
                    );
  return iVar1;
}

Assistant:

virtual inline int LA(unsigned int i)
	{
		fill(i);
		return queue.elementAt(markerOffset + i - 1);
	}